

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O1

unsigned_long ndiGetTXFrame(ndicapi *pol,int ph)

{
  uint uVar1;
  unsigned_long uVar2;
  ulong uVar3;
  
  uVar1 = pol->TxHandleCount;
  uVar3 = 0;
  if (0 < (int)uVar1) {
    do {
      if ((uint)pol->TxHandles[uVar3] == ph) goto LAB_00109319;
      uVar3 = uVar3 + 1;
    } while (uVar1 != uVar3);
    uVar3 = (ulong)uVar1;
  }
LAB_00109319:
  if ((uint)uVar3 == uVar1) {
    return 0;
  }
  uVar2 = ndiHexToUnsignedLong(pol->TxFrame[uVar3 & 0xffffffff],8);
  return uVar2;
}

Assistant:

ndicapiExport unsigned long ndiGetTXFrame(ndicapi* pol, int ph)
{
  char* dp;
  int i, n;

  n = pol->TxHandleCount;
  for (i = 0; i < n; i++)
  {
    if (pol->TxHandles[i] == ph)
    {
      break;
    }
  }
  if (i == n)
  {
    return 0;
  }

  dp = pol->TxFrame[i];

  return (unsigned long)ndiHexToUnsignedLong(dp, 8);
}